

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetRudderSSC32(SSC32 *pSSC32,double angle)

{
  int iVar1;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  double local_70;
  double local_60;
  double local_48;
  double local_40;
  double angletmp;
  int pw;
  double angle_local;
  SSC32 *pSSC32_local;
  
  if (angle < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_60 = pSSC32->MaxAngle;
    }
    else {
      local_60 = pSSC32->MinAngle;
    }
    local_60 = ABS(local_60);
    local_48 = pSSC32->MidAngle + (angle * (pSSC32->MidAngle - pSSC32->MinAngle)) / local_60;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_40 = pSSC32->MaxAngle;
    }
    else {
      local_40 = pSSC32->MinAngle;
    }
    local_40 = ABS(local_40);
    local_48 = pSSC32->MidAngle + (angle * (pSSC32->MaxAngle - pSSC32->MidAngle)) / local_40;
  }
  if (local_48 < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_80 = pSSC32->MaxAngle;
    }
    else {
      local_80 = pSSC32->MinAngle;
    }
    local_80 = ABS(local_80);
    local_70 = (local_48 * 500.0) / local_80;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_70 = pSSC32->MaxAngle;
    }
    else {
      local_70 = pSSC32->MinAngle;
    }
    local_70 = ABS(local_70);
    local_70 = (local_48 * 500.0) / local_70;
  }
  angletmp._4_4_ = (int)local_70 + 0x5dc;
  if (angletmp._4_4_ < 2000) {
    local_84 = angletmp._4_4_;
  }
  else {
    local_84 = 2000;
  }
  if (local_84 < 0x3e9) {
    local_8c = 1000;
  }
  else {
    if (angletmp._4_4_ < 2000) {
      local_88 = angletmp._4_4_;
    }
    else {
      local_88 = 2000;
    }
    local_8c = local_88;
  }
  iVar1 = SetPWMSSC32(pSSC32,pSSC32->rudderchan,local_8c);
  return iVar1;
}

Assistant:

inline int SetRudderSSC32(SSC32* pSSC32, double angle)
{
	int pw = 0;
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pw = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pw = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pw = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE

	pw = max(min(pw, DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	return SetPWMSSC32(pSSC32, pSSC32->rudderchan, pw);
}